

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O2

TCPConnection * __thiscall
ProtocolTCP::NewClient
          (ProtocolTCP *this,InterfaceMAC *mac,uint8_t *remoteAddress,uint16_t remotePort,
          uint16_t localPort)

{
  TCPConnection *this_00;
  uint16_t *puVar1;
  uint16_t *puVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  uint8_t *puVar6;
  
  lVar4 = 0;
  puVar1 = (uint16_t *)&this[-1].field_0xe74;
  do {
    puVar2 = puVar1;
    lVar4 = lVar4 + -0x370;
    if (lVar4 == -0x14a0) {
      return (TCPConnection *)0x0;
    }
    puVar1 = puVar2 + 0x1b8;
  } while (*(int *)(puVar2 + 0x1b6) != 0);
  this_00 = (TCPConnection *)((long)this + (-0x370 - lVar4));
  TCPConnection::Allocate(this_00,mac);
  puVar2[0x1b8] = localPort;
  puVar2[0x1bc] = 1;
  puVar2[0x1bd] = 0;
  puVar2[0x1c2] = 0x401;
  puVar2[0x1c3] = 0;
  puVar6 = (uint8_t *)((long)this + (-0x368 - lVar4));
  for (uVar5 = 0; sVar3 = ProtocolIPv4::AddressSize(this->IP), uVar5 < sVar3; uVar5 = uVar5 + 1) {
    *puVar6 = remoteAddress[uVar5];
    puVar6 = puVar6 + 1;
  }
  puVar2[0x1b9] = remotePort;
  return this_00;
}

Assistant:

TCPConnection* ProtocolTCP::NewClient(InterfaceMAC* mac,
                                      const uint8_t* remoteAddress,
                                      uint16_t remotePort,
                                      uint16_t localPort)
{
    size_t i;
    size_t j;

    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        TCPConnection& connection = ConnectionList[i];
        if (connection.State == TCPConnection::CLOSED)
        {
            connection.Allocate(mac);
            connection.LocalPort = localPort;
            connection.SequenceNumber = 1;
            connection.MaxSequenceTx = connection.SequenceNumber + 1024;
            for (j = 0; j < IP.AddressSize(); j++)
            {
                connection.RemoteAddress[j] = remoteAddress[j];
            }
            connection.RemotePort = remotePort;

            return &connection;
        }
    }

    return nullptr;
}